

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcConfigList.cpp
# Opt level: O0

void glcts::getDefaultConfigList(Platform *platform,ApiType type,ConfigList *configList)

{
  ConfigList *this;
  bool bVar1;
  Config local_5c;
  exception *e_1;
  exception *e;
  deUint32 local_24;
  ConfigList *local_20;
  ConfigList *configList_local;
  Platform *platform_local;
  ApiType type_local;
  
  local_24 = type.m_bits;
  local_20 = configList;
  configList_local = (ConfigList *)platform;
  platform_local._4_4_ = type.m_bits;
  getConfigListEGL(platform,type,configList);
  e_1._4_4_ = platform_local._4_4_;
  getConfigListWGL((Platform *)configList_local,platform_local._4_4_,local_20);
  bVar1 = std::vector<glcts::Config,_std::allocator<glcts::Config>_>::empty(&local_20->configs);
  if (bVar1) {
    qpPrintf("Warning: No configs enumerated, adding only default config!\n");
    this = local_20;
    Config::Config(&local_5c,CONFIGTYPE_DEFAULT,0,1);
    std::vector<glcts::Config,_std::allocator<glcts::Config>_>::push_back(&this->configs,&local_5c);
  }
  return;
}

Assistant:

void getDefaultConfigList(tcu::Platform& platform, glu::ApiType type, ConfigList& configList)
{
	try
	{
		getConfigListEGL(platform, type, configList);
	}
	catch (const std::exception& e)
	{
		qpPrintf("No EGL configs enumerated: %s\n", e.what());
	}

	try
	{
		getConfigListWGL(platform, type, configList);
	}
	catch (const std::exception& e)
	{
		qpPrintf("No WGL configs enumerated: %s\n", e.what());
	}

	if (configList.configs.empty())
	{
		qpPrintf("Warning: No configs enumerated, adding only default config!\n");
		configList.configs.push_back(Config(CONFIGTYPE_DEFAULT, 0, SURFACETYPE_WINDOW));
	}
}